

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_C2_Req.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_SYNDICATED_C2_REQ::data(SRUP_MSG_SYNDICATED_C2_REQ *this,uint32_t data)

{
  uint8_t *puVar1;
  uint8_t len;
  uint32_t data_local;
  SRUP_MSG_SYNDICATED_C2_REQ *this_local;
  
  (this->super_SRUP_MSG).m_is_serialized = false;
  if ((this->m_data != (uint8_t *)0x0) && (this->m_data != (uint8_t *)0x0)) {
    operator_delete__(this->m_data);
  }
  puVar1 = (uint8_t *)operator_new__(4);
  this->m_data = puVar1;
  *(uint32_t *)this->m_data = data;
  this->m_data_len = 4;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_C2_REQ::data(const uint32_t data)
{
    m_is_serialized = false;
    const uint8_t len = 4;

    if (m_data != nullptr)
        delete[] m_data;

    m_data = new uint8_t[len];
    std::memcpy(m_data, &data, len);
    m_data_len = len;
    return true;
}